

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

double derivative_in_direction(vw *all,bfgs *b,float *mem,int *origin)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  double dVar4;
  
  if ((all->weights).sparse != true) {
    dVar4 = derivative_in_direction<dense_parameters>
                      (all,b,mem,origin,&(all->weights).dense_weights);
    return dVar4;
  }
  p_Var3 = (all->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    dVar4 = 0.0;
    do {
      p_Var1 = p_Var3 + 1;
      p_Var2 = p_Var3 + 2;
      p_Var3 = p_Var3->_M_nxt;
      dVar4 = dVar4 + (double)*(float *)&p_Var2->_M_nxt[1]._M_nxt *
                      (double)mem[(long)(*origin % b->mem_stride) +
                                  ((ulong)p_Var1->_M_nxt >>
                                  ((byte)(all->weights).sparse_weights._stride_shift & 0x3f)) *
                                  (long)b->mem_stride];
    } while (p_Var3 != (_Hash_node_base *)0x0);
    return dVar4;
  }
  return 0.0;
}

Assistant:

double derivative_in_direction(vw& all, bfgs& b, float* mem, int& origin)
{
  if (all.weights.sparse)
    return derivative_in_direction(all, b, mem, origin, all.weights.sparse_weights);
  else
    return derivative_in_direction(all, b, mem, origin, all.weights.dense_weights);
}